

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

string * units::probeUnit_abi_cxx11_
                   (precise_unit *un,pair<units::precise_unit,_const_char_*> *probe)

{
  bool bVar1;
  unit un_00;
  unit this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  unit __lhs;
  string *in_RDI;
  precise_unit pVar2;
  string fnd;
  precise_unit ext;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  precise_unit *in_stack_fffffffffffffd90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  precise_unit *in_stack_fffffffffffffda0;
  precise_unit *in_stack_fffffffffffffda8;
  precise_unit *in_stack_fffffffffffffdb0;
  allocator<char> *__a;
  char *in_stack_fffffffffffffdb8;
  allocator<char> *__s;
  unit in_stack_fffffffffffffdc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_211 [2];
  double local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c8;
  unit local_1c0;
  unit local_178;
  allocator<char> *local_150;
  undefined8 uStack_148;
  allocator<char> local_139 [129];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  unit local_b0;
  unit local_a8;
  undefined4 local_80;
  unit local_50;
  allocator<char> *local_28;
  undefined8 uStack_20;
  
  pVar2 = precise_unit::operator*
                    (in_stack_fffffffffffffda0,(precise_unit *)in_stack_fffffffffffffd98);
  uStack_20 = pVar2._8_8_;
  local_28 = (allocator<char> *)pVar2.multiplier_;
  local_50 = unit_cast((precise_unit *)in_stack_fffffffffffffd88);
  find_unit_abi_cxx11_(in_stack_fffffffffffffdc8);
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6bd259);
  if (bVar1) {
    pVar2 = precise_unit::inv(in_stack_fffffffffffffd90);
    un_00 = pVar2._8_8_;
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pVar2.multiplier_
    ;
    local_b8 = this_01;
    local_b0 = un_00;
    this = unit_cast((precise_unit *)in_stack_fffffffffffffd88);
    local_a8 = this;
    find_unit_abi_cxx11_(un_00);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)un_00);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd80);
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6bd396);
    if (bVar1) {
      pVar2 = precise_unit::operator/(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      uStack_148 = pVar2._8_8_;
      __a = (allocator<char> *)pVar2.multiplier_;
      local_150 = __a;
      local_28 = __a;
      uStack_20 = uStack_148;
      local_178 = unit_cast((precise_unit *)in_stack_fffffffffffffd88);
      find_unit_abi_cxx11_(un_00);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)un_00);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd80);
      bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6bd5fd);
      if (bVar1) {
        pVar2 = precise_unit::inv(in_stack_fffffffffffffd90);
        this_00 = pVar2._8_8_;
        local_1d0 = pVar2.multiplier_;
        local_1c8 = this_00;
        __lhs = unit_cast((precise_unit *)in_stack_fffffffffffffd88);
        local_1c0 = __lhs;
        find_unit_abi_cxx11_(un_00);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=(this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)un_00
                 );
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd80);
        bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x6bd71d);
        if (bVar1) {
          std::__cxx11::string::string(this_00);
        }
        else {
          in_stack_fffffffffffffd80 = local_211;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     in_stack_fffffffffffffdb8,__a);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                         (char)((ulong)in_stack_fffffffffffffd80 >> 0x38));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                         in_stack_fffffffffffffd80);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd80);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd80);
          std::allocator<char>::~allocator((allocator<char> *)local_211);
        }
      }
      else {
        std::operator+(in_stack_fffffffffffffd98,(char)((ulong)in_stack_fffffffffffffd90 >> 0x38));
        std::operator+(in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd80);
      }
    }
    else {
      __s = local_139;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)__s,(allocator<char> *)in_stack_fffffffffffffdb0);
      std::operator+(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
      std::operator+(in_stack_fffffffffffffd88,(char)((ulong)in_stack_fffffffffffffd80 >> 0x38));
      std::operator+(in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
      std::operator+(in_stack_fffffffffffffd88,(char)((ulong)in_stack_fffffffffffffd80 >> 0x38));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd80);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd80);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd80);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd80);
      std::allocator<char>::~allocator(local_139);
    }
  }
  else {
    std::operator+(in_stack_fffffffffffffd98,(char)((ulong)in_stack_fffffffffffffd90 >> 0x38));
    std::operator+(in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd80);
  }
  local_80 = 1;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd80);
  return in_RDI;
}

Assistant:

static std::string probeUnit(
    const precise_unit& un,
    const std::pair<precise_unit, const char*>& probe)
{
    // let's try common divisor units
    auto ext = un * probe.first;
    auto fnd = find_unit(unit_cast(ext));
    if (!fnd.empty()) {
        return fnd + '/' + probe.second;
    }
    // let's try inverse of common multiplier units
    fnd = find_unit(unit_cast(ext.inv()));
    if (!fnd.empty()) {
        return std::string("1/(") + fnd + '*' + probe.second + ')';
    }

    // let's try common multiplier units
    ext = un / probe.first;
    fnd = find_unit(unit_cast(ext));
    if (!fnd.empty()) {
        return fnd + '*' + probe.second;
    }
    // let's try common divisor with inv units
    fnd = find_unit(unit_cast(ext.inv()));
    if (!fnd.empty()) {
        return std::string(probe.second) + '/' + fnd;
    }
    return std::string{};
}